

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void super_(_Bool canAssign)

{
  Token name_00;
  Token name_01;
  Token name_02;
  _Bool _Var1;
  uint8_t argCount;
  uint8_t name;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 local_38;
  char *local_18;
  
  if (currentClass == (ClassCompiler *)0x0) {
    error((char *)0x106483);
  }
  else if ((currentClass->hasSuperclass & 1U) == 0) {
    error((char *)0x10649e);
  }
  consume((TokenType)((ulong)in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffff88);
  consume((TokenType)((ulong)in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffff88);
  identifierConstant((Token *)0x1064d2);
  syntheticToken(in_stack_ffffffffffffff90);
  name_00.start = (char *)in_stack_ffffffffffffffa8;
  name_00._0_8_ = in_stack_ffffffffffffffa0;
  name_00.length = (int)in_stack_ffffffffffffffb0;
  name_00.line = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  namedVariable(name_00,SUB81((ulong)local_18 >> 0x38,0));
  _Var1 = match(0x106513);
  if (_Var1) {
    argumentList();
    syntheticToken(local_18);
    name_01.start = (char *)in_stack_ffffffffffffffa8;
    name_01._0_8_ = in_stack_ffffffffffffffa0;
    name_01.length = (int)in_stack_ffffffffffffffb0;
    name_01.line = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    namedVariable(name_01,SUB81((ulong)local_38 >> 0x38,0));
    emitBytes('\0','\0');
    emitByte('\0');
  }
  else {
    syntheticToken(local_18);
    name_02.start = (char *)in_stack_ffffffffffffffa8;
    name_02._0_8_ = in_stack_ffffffffffffffa0;
    name_02.length = (int)in_stack_ffffffffffffffb0;
    name_02.line = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    namedVariable(name_02,SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
    emitBytes('\0','\0');
  }
  return;
}

Assistant:

static void super_(bool canAssign) {
    if (currentClass == NULL) {
        error("Cannot use 'super' outside of a class.");
    } else if (!currentClass->hasSuperclass) {
        error("Cannot use 'super' in a class with no superclass.");
    }

    consume(TOKEN_DOT, "Expect '.' after 'super'.");
    consume(TOKEN_IDENTIFIER, "Expect superclass method name.");
    uint8_t name = identifierConstant(&parser.previous);

    namedVariable(syntheticToken("this"), false);

    if (match(TOKEN_LEFT_PAREN)) {
        uint8_t argCount = argumentList();
        namedVariable(syntheticToken("super"), false);
        emitBytes(OP_SUPER_INVOKE, name);
        emitByte(argCount);
    } else {
        namedVariable(syntheticToken("super"), false);
        emitBytes(OP_GET_SUPER, name);
    }
}